

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::IntersectClauseSyntax::setChild
          (IntersectClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  RangeListSyntax *pRVar7;
  
  if (index == 0) {
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar6->field_0x2;
    NVar3.raw = (pvVar6->numFlags).raw;
    uVar4 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->intersect).kind = pvVar6->kind;
    (this->intersect).field_0x2 = uVar2;
    (this->intersect).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->intersect).rawLen = uVar4;
    (this->intersect).info = pIVar1;
  }
  else {
    ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pRVar7 = (RangeListSyntax *)0x0;
    }
    else {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pRVar7 = (RangeListSyntax *)*ppSVar5;
    }
    (this->ranges).ptr = pRVar7;
  }
  return;
}

Assistant:

void IntersectClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: intersect = child.token(); return;
        case 1: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}